

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_rar5.c
# Opt level: O0

wchar_t parse_htime_item(archive_read *a,char unix_time,int64_t *sec,uint32_t *nsec,
                        int64_t *extra_data_size)

{
  char cVar1;
  uint64_t local_48;
  uint64_t windows_time;
  int64_t *piStack_38;
  uint32_t time_val;
  int64_t *extra_data_size_local;
  uint32_t *nsec_local;
  int64_t *sec_local;
  archive_read *paStack_18;
  char unix_time_local;
  archive_read *a_local;
  
  piStack_38 = extra_data_size;
  extra_data_size_local = (int64_t *)nsec;
  nsec_local = (uint32_t *)sec;
  sec_local._7_1_ = unix_time;
  paStack_18 = a;
  if (unix_time == '\0') {
    cVar1 = read_u64(a,&local_48);
    if (cVar1 == '\0') {
      return L'\x01';
    }
    ntfs_to_unix(local_48,(int64_t *)nsec_local,(uint32_t *)extra_data_size_local);
    *piStack_38 = *piStack_38 + -8;
  }
  else {
    cVar1 = read_u32(a,(uint32_t *)((long)&windows_time + 4));
    if (cVar1 == '\0') {
      return L'\x01';
    }
    *piStack_38 = *piStack_38 + -4;
    *(ulong *)nsec_local = (ulong)windows_time._4_4_;
  }
  return L'\0';
}

Assistant:

static int parse_htime_item(struct archive_read* a, char unix_time,
    int64_t* sec, uint32_t* nsec, int64_t* extra_data_size)
{
	if(unix_time) {
		uint32_t time_val;
		if(!read_u32(a, &time_val))
			return ARCHIVE_EOF;

		*extra_data_size -= 4;
		*sec = (int64_t) time_val;
	} else {
		uint64_t windows_time;
		if(!read_u64(a, &windows_time))
			return ARCHIVE_EOF;

		ntfs_to_unix(windows_time, sec, nsec);
		*extra_data_size -= 8;
	}

	return ARCHIVE_OK;
}